

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiowrt.c
# Opt level: O3

void fiowrt(mcmcxdef *mctx,voccxdef *vctx,tokcxdef *tokctx,tokthdef *tab,uchar *fmts,uint fmtl,
           char *fname,uint flags,objnum preinit,int extc,uint prpcnt,char *filever)

{
  undefined1 uVar1;
  undefined1 uVar2;
  byte bVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  errcxdef *ctx;
  vocidef *pvVar7;
  lindef *plVar8;
  uchar *__ptr;
  FILE *__stream;
  uint16_t tmp;
  uint seed;
  FILE *__stream_00;
  size_t sVar9;
  tm *__tp;
  ulong uVar10;
  size_t sVar11;
  long __off;
  long lVar12;
  ulong uVar13;
  vocdef *pvVar14;
  uint inc;
  int iVar15;
  vocidef ***pppvVar16;
  vocdef **ppvVar17;
  int iVar18;
  osfildef *fp2;
  char *pcVar19;
  uint16_t tmp_7;
  vocwdef *pvVar20;
  int iVar21;
  short sVar22;
  vocidef **ppvVar23;
  fiowcxdef cbctx;
  time_t timer;
  errdef fr_;
  char flag_buf [2];
  char fastnamebuf [4096];
  undefined2 local_1668;
  undefined1 uStack_1666;
  undefined1 uStack_1665;
  ushort local_1664;
  undefined1 uStack_1662;
  byte local_1661;
  byte bStack_1660;
  undefined2 auStack_165f [43];
  ulong local_1608;
  vocidef ***local_1600;
  ulong local_15f8;
  ulong local_15f0;
  vocdef **local_15e8;
  ulong local_15e0;
  vocidef ***local_15d8;
  long local_15d0;
  mcmcxdef *local_15c8;
  uchar *local_15c0;
  tokcxdef *local_15b8;
  mcmcxdef *local_15b0;
  errcxdef *local_15a8;
  FILE *local_15a0;
  uint local_1598;
  int local_1594;
  FILE *local_1590;
  uint local_1588;
  uint local_1584;
  uint local_1580;
  time_t local_1578;
  errdef local_1570;
  toksdef local_1438 [22];
  char local_1038 [4104];
  
  __stream_00 = fopen(fname,"w+b");
  if (__stream_00 == (FILE *)0x0) {
    errsigf(vctx->voccxerr,"TADS",600);
  }
  local_15c8 = mctx;
  local_15b8 = tokctx;
  local_1570.errcode = _setjmp((__jmp_buf_tag *)local_1570.errbuf);
  if (local_1570.errcode != 0) {
    vctx->voccxerr->errcxptr = local_1570.errprv;
    fclose(__stream_00);
    errrse1(vctx->voccxerr,&local_1570);
  }
  local_1570.errprv = vctx->voccxerr->errcxptr;
  vctx->voccxerr->errcxptr = &local_1570;
  ctx = vctx->voccxerr;
  bVar3 = *filever;
  if (bVar3 < 0x62) {
    if (bVar3 == 0x2a) {
LAB_00118169:
      pcVar19 = "v2.2.0";
      goto LAB_00118170;
    }
    if (bVar3 != 0x61) {
LAB_0011905e:
      errsigf(ctx,"TADS",0x267);
    }
    pcVar19 = "v2.0.0";
    inc = 0x1d;
    seed = 0x11;
  }
  else {
    if (bVar3 == 99) goto LAB_00118169;
    if (bVar3 != 0x62) goto LAB_0011905e;
    pcVar19 = "v2.0.1";
LAB_00118170:
    inc = 0x40;
    seed = 0x3f;
  }
  local_15c0 = fmts;
  sVar9 = fwrite("TADS2 bin\n\r\x1a",0xd,1,__stream_00);
  if (sVar9 == 1) {
    sVar9 = fwrite(pcVar19,7,1,__stream_00);
    if (sVar9 == 1) {
      local_15d0 = ftell(__stream_00);
      local_1668._0_1_ = (uchar)flags;
      local_1668._1_1_ = (undefined1)(flags >> 8);
      sVar9 = fwrite(&local_1668,2,1,__stream_00);
      if (sVar9 == 1) {
        local_1578 = time((time_t *)0x0);
        __tp = localtime(&local_1578);
        pcVar19 = asctime(__tp);
        strcpy(vctx->voccxtim,pcVar19);
        sVar9 = fwrite(vctx->voccxtim,0x1a,1,__stream_00);
        if (sVar9 == 1) {
          if (*filever != 'a') {
            uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\x03XSI");
            local_1668._0_1_ = (uchar)seed;
            local_1668._1_1_ = (undefined1)inc;
            sVar9 = fwrite(&local_1668,2,1,__stream_00);
            if (sVar9 != 1) goto LAB_00118fc5;
            fiowcls((osfildef *)__stream_00,ctx,uVar10);
          }
          if (extc != 0) {
            uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\x06EXTCNT");
            local_1668._0_1_ = (uchar)extc;
            local_1668._1_1_ = (undefined1)((uint)extc >> 8);
            sVar9 = fwrite(&local_1668,2,1,__stream_00);
            if (sVar9 != 1) goto LAB_00118fc5;
            if (*filever != 'a') {
              local_1668._0_1_ = '\0';
              local_1668._1_1_ = 0;
              uStack_1666 = 0;
              uStack_1665 = 0;
              sVar9 = fwrite(&local_1668,4,1,__stream_00);
              if (sVar9 != 1) goto LAB_00118fc5;
            }
            fiowcls((osfildef *)__stream_00,ctx,uVar10);
          }
          if (G_cmap_id[0] != '\0') {
            if ((byte)(*filever + 0x9fU) < 3) {
              errsigf(ctx,"TADS",0x268);
            }
            uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\x06CHRSET");
            sVar9 = strlen(G_cmap_ldesc);
            sVar9 = sVar9 + 1;
            local_1668._0_1_ = (uchar)sVar9;
            local_1668._1_1_ = (undefined1)(sVar9 >> 8);
            sVar11 = fwrite(G_cmap_id,4,1,__stream_00);
            if (sVar11 != 1) goto LAB_00118fc5;
            sVar11 = fwrite(&local_1668,2,1,__stream_00);
            if (sVar11 != 1) goto LAB_00118fc5;
            sVar9 = fwrite(G_cmap_ldesc,sVar9,1,__stream_00);
            if (sVar9 != 1) goto LAB_00118fc5;
            fiowcls((osfildef *)__stream_00,ctx,uVar10);
          }
          uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\x03OBJ");
          local_15b0 = local_15c8;
          local_1594 = 0;
          local_1580 = flags & 1;
          local_15a8 = ctx;
          local_15a0 = __stream_00;
          local_1588 = seed;
          local_1584 = inc;
          if ((flags & 0x20) == 0) {
            local_1590 = (FILE *)0x0;
          }
          else {
            local_1590 = (FILE *)os_create_tempfile((char *)0x0,local_1038);
            lVar12 = local_15d0;
            if (local_1590 == (FILE *)0x0) {
              flags = flags & 0xffffffdf;
              __off = ftell(__stream_00);
              fseek(__stream_00,lVar12,0);
              local_1438[0]._0_2_ = (undefined2)flags;
              sVar9 = fwrite(local_1438,2,1,__stream_00);
              if (sVar9 != 1) {
LAB_00118fb9:
                goto LAB_00118fc5;
              }
              fseek(__stream_00,__off,0);
            }
          }
          local_15f8 = uVar10;
          local_1598 = flags;
          toktheach(&tab->tokthsc,fiowrtobj,&local_15b0);
          pppvVar16 = vctx->voccxinh;
          iVar15 = 0;
          sVar22 = 0;
          local_15d8 = pppvVar16;
          do {
            ppvVar23 = *pppvVar16;
            if (ppvVar23 != (vocidef **)0x0) {
              lVar12 = 0;
              do {
                pvVar7 = ppvVar23[lVar12];
                if ((pvVar7 != (vocidef *)0x0) &&
                   (bVar3 = (pvVar7->vociu).vocius.vociusflg, (bVar3 & 0x10) != 0)) {
                  local_1438[0].toksval = sVar22 + (short)lVar12;
                  (pvVar7->vociu).vocius.vociusflg = bVar3 & 0xef;
                  local_1438[0].tokstyp = '\x02';
                  fiowrtobj(&local_15b0,local_1438);
                }
                lVar12 = lVar12 + 1;
              } while ((int)lVar12 != 0x100);
            }
            pppvVar16 = pppvVar16 + 1;
            iVar15 = iVar15 + 1;
            sVar22 = sVar22 + 0x100;
          } while (iVar15 != 0x80);
          fiowcls((osfildef *)__stream_00,ctx,local_15f8);
          __stream = local_1590;
          if (local_1590 != (FILE *)0x0) {
            local_1608 = fiowhd((osfildef *)__stream_00,ctx,"\x03FST");
            uVar13 = ftell(__stream);
            fseek(__stream,0,0);
            if (uVar13 != 0) {
              do {
                sVar9 = 0x400;
                if (uVar13 < 0x400) {
                  sVar9 = uVar13;
                }
                sVar11 = fread(local_1438,sVar9,1,__stream);
                if ((sVar11 != 1) || (sVar11 = fwrite(local_1438,sVar9,1,__stream_00), sVar11 != 1))
                goto LAB_00118fb9;
                uVar13 = uVar13 - sVar9;
              } while (uVar13 != 0);
            }
            fiowcls((osfildef *)__stream_00,ctx,local_1608);
            fclose(__stream);
            osfdel_temp(local_1038);
          }
          local_15f0 = fiowhd((osfildef *)__stream_00,ctx,"\x03INH");
          iVar21 = 0x100;
          iVar15 = 0;
          pppvVar16 = local_15d8;
          do {
            ppvVar23 = *pppvVar16;
            local_1600 = pppvVar16;
            if (ppvVar23 != (vocidef **)0x0) {
              iVar18 = iVar15 << 8;
              do {
                pvVar7 = *ppvVar23;
                if (pvVar7 != (vocidef *)0x0) {
                  local_1668._0_1_ = (pvVar7->vociu).vocius.vociusflg;
                  local_1668._1_1_ = (undefined1)iVar18;
                  uStack_1666 = (undefined1)((uint)iVar18 >> 8);
                  uVar4 = *(undefined4 *)((long)&pvVar7->vociu + 2);
                  uStack_1665 = (undefined1)uVar4;
                  local_1664 = (ushort)((uint)uVar4 >> 8);
                  uStack_1662 = (undefined1)((uint)uVar4 >> 0x18);
                  local_1661 = pvVar7->vocinsc;
                  bStack_1660 = 0;
                  uVar13 = 0;
                  if (local_1661 != 0) {
                    do {
                      if (uVar13 == 0x50) {
                        errsigf(ctx,"TADS",0x25a);
                      }
                      auStack_165f[uVar13] = *(undefined2 *)((long)&pvVar7->vociu + uVar13 * 2 + 6);
                      uVar13 = uVar13 + 1;
                    } while (local_1661 != uVar13);
                  }
                  sVar9 = fwrite(&local_1668,(ulong)local_1661 * 2 + 9,1,__stream_00);
                  if (sVar9 != 1) goto LAB_00118fb9;
                }
                ppvVar23 = ppvVar23 + 1;
                iVar18 = iVar18 + 1;
              } while (iVar18 != iVar21);
            }
            pppvVar16 = local_1600 + 1;
            iVar15 = iVar15 + 1;
            iVar21 = iVar21 + 0x100;
          } while (iVar15 != 0x80);
          fiowcls((osfildef *)__stream_00,ctx,local_15f0);
          if (fmtl != 0) {
            uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\x06FMTSTR");
            __ptr = local_15c0;
            local_1668._0_1_ = (uchar)fmtl;
            local_1668._1_1_ = (undefined1)(fmtl >> 8);
            if ((flags & 8) != 0) {
              fioxor(local_15c0,fmtl,seed,inc);
            }
            sVar9 = fwrite(&local_1668,2,1,__stream_00);
            if (sVar9 != 1) goto LAB_00118fc5;
            sVar9 = fwrite(__ptr,(ulong)fmtl,1,__stream_00);
            if (sVar9 != 1) goto LAB_00118fc5;
            fiowcls((osfildef *)__stream_00,ctx,uVar10);
          }
          if ((flags & 4) != 0) {
            uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\aPREINIT");
            local_1668 = preinit;
            sVar9 = fwrite(&local_1668,2,1,__stream_00);
            if (sVar9 != 1) goto LAB_00118fc5;
            fiowcls((osfildef *)__stream_00,ctx,uVar10);
          }
          uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\x03REQ");
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxme);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxvtk);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxstr);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxnum);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxprd);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxvag);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxini);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpre);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxper);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxprom);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpdis);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxper2);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpdef);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpask);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxppc);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpask2);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxperp);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpostprom);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxinitrestore);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpuv);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpnp);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpostact);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxendcmd);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxprecmd);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpask3);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpre2);
          fiowrq(ctx,(osfildef *)__stream_00,vctx->voccxpdef2);
          fiowcls((osfildef *)__stream_00,ctx,uVar10);
          if (vctx->voccxcpl != 0) {
            uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\x04CMPD");
            uVar5 = vctx->voccxcpl;
            local_1668._0_1_ = (uchar)uVar5;
            local_1668._1_1_ = (undefined1)(uVar5 >> 8);
            if ((flags & 8) != 0) {
              fioxor((uchar *)vctx->voccxcpp,uVar5,seed,inc);
            }
            sVar9 = fwrite(&local_1668,2,1,__stream_00);
            if (sVar9 != 1) goto LAB_00118fc5;
            sVar9 = fwrite(vctx->voccxcpp,(ulong)(uint)vctx->voccxcpl,1,__stream_00);
            if (sVar9 != 1) goto LAB_00118fc5;
            fiowcls((osfildef *)__stream_00,ctx,uVar10);
          }
          if (vctx->voccxspl != 0) {
            uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\bSPECWORD");
            uVar5 = vctx->voccxspl;
            local_1668._0_1_ = (uchar)uVar5;
            local_1668._1_1_ = (undefined1)(uVar5 >> 8);
            if ((flags & 8) != 0) {
              fioxor((uchar *)vctx->voccxspp,uVar5,seed,inc);
            }
            sVar9 = fwrite(&local_1668,2,1,__stream_00);
            if (sVar9 != 1) goto LAB_00118fc5;
            sVar9 = fwrite(vctx->voccxspp,(ulong)(uint)vctx->voccxspl,1,__stream_00);
            if (sVar9 != 1) goto LAB_00118fc5;
            fiowcls((osfildef *)__stream_00,ctx,uVar10);
          }
          local_15e0 = fiowhd((osfildef *)__stream_00,ctx,"\x03VOC");
          ppvVar17 = vctx->voccxhsh;
          iVar15 = 0;
          do {
            local_15e8 = ppvVar17;
            for (pvVar14 = *ppvVar17; pvVar14 != (vocdef *)0x0; pvVar14 = pvVar14->vocnxt) {
              if ((flags & 8) != 0) {
                fioxor(pvVar14->voctxt,(uint)pvVar14->vocln2 + (uint)pvVar14->voclen,seed,inc);
              }
              uVar6 = pvVar14->vocwlst;
              if ((uVar6 != 0xffffffff) && (vctx->voccxwp[(ulong)uVar6 / 2000] != (vocwdef *)0x0)) {
                pvVar20 = vctx->voccxwp[(ulong)uVar6 / 2000] + uVar6 % 2000;
                do {
                  bStack_1660 = pvVar20->vocwflg & 0xfb;
                  pvVar20->vocwflg = bStack_1660;
                  uVar1 = pvVar14->voclen;
                  uVar2 = pvVar14->vocln2;
                  local_1668._1_1_ = 0;
                  uStack_1665 = 0;
                  local_1664 = (ushort)pvVar20->vocwtyp;
                  uStack_1662 = (undefined1)pvVar20->vocwobj;
                  local_1661 = (byte)(pvVar20->vocwobj >> 8);
                  auStack_165f[0]._0_1_ = 0;
                  local_1668._0_1_ = uVar1;
                  uStack_1666 = uVar2;
                  sVar9 = fwrite(&local_1668,10,1,__stream_00);
                  if (sVar9 != 1) goto LAB_00118fb9;
                  sVar9 = fwrite(pvVar14->voctxt,(ulong)pvVar14->vocln2 + (ulong)pvVar14->voclen,1,
                                 __stream_00);
                  if (sVar9 != 1) goto LAB_00118fb9;
                  uVar6 = pvVar20->vocwnxt;
                  local_1668 = CONCAT11(local_1668._1_1_,(uchar)local_1668);
                } while ((uVar6 != 0xffffffff) &&
                        (pvVar20 = vctx->voccxwp[(ulong)uVar6 / 2000] + uVar6 % 2000,
                        local_1668 = CONCAT11(local_1668._1_1_,(uchar)local_1668),
                        vctx->voccxwp[(ulong)uVar6 / 2000] != (vocwdef *)0x0));
              }
            }
            iVar15 = iVar15 + 1;
            ppvVar17 = local_15e8 + 1;
          } while (iVar15 != 0x100);
          fiowcls((osfildef *)__stream_00,ctx,local_15e0);
          if ((flags & 1) != 0) {
            uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\x06SYMTAB");
            toktheach(&tab->tokthsc,fiowrtsym,&local_15b0);
            local_1668._0_1_ = 0;
            sVar9 = fwrite(&local_1668,4,1,__stream_00);
            if (sVar9 != 1) goto LAB_00118fc5;
            fiowcls((osfildef *)__stream_00,ctx,uVar10);
          }
          if (((flags & 0x82) != 0) && (vctx->voccxrun->runcxdbg != (dbgcxdef *)0x0)) {
            uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\x03SRC");
            for (plVar8 = vctx->voccxrun->runcxdbg->dbgcxlin; plVar8 != (lindef *)0x0;
                plVar8 = plVar8->linnxt) {
              iVar15 = (*plVar8->linwrtp)(plVar8,(osfildef *)__stream_00);
              if (iVar15 != 0) goto LAB_00118fc5;
            }
            fiowcls((osfildef *)__stream_00,ctx,uVar10);
            if ((char)flags < '\0') {
              uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\x04SRC2");
              fiowcls((osfildef *)__stream_00,ctx,uVar10);
            }
          }
          if ((flags & 0x10) != 0) {
            uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\x06PRPCNT");
            local_1668._0_1_ = (uchar)prpcnt;
            local_1668._1_1_ = (undefined1)(prpcnt >> 8);
            sVar9 = fwrite(&local_1668,2,1,__stream_00);
            if (sVar9 != 1) goto LAB_00118fc5;
            fiowcls((osfildef *)__stream_00,ctx,uVar10);
            uVar10 = fiowhd((osfildef *)__stream_00,ctx,"\x06TADSPP");
            tok_write_defines(local_15b8,(osfildef *)__stream_00,ctx);
            fiowcls((osfildef *)__stream_00,ctx,uVar10);
          }
          fiowhd((osfildef *)__stream_00,ctx,"\x04$EOF");
          fclose(__stream_00);
          if (local_1594 == 0) {
            os_settype(fname,0);
            vctx->voccxerr->errcxptr = local_1570.errprv;
            return;
          }
          errsigf(ctx,"TADS",0x25d);
        }
      }
    }
  }
LAB_00118fc5:
  errsigf(ctx,"TADS",0x259);
}

Assistant:

void fiowrt(mcmcxdef *mctx, voccxdef *vctx, tokcxdef *tokctx, tokthdef *tab,
            uchar *fmts, uint fmtl, char *fname, uint flags, objnum preinit,
            int extc, uint prpcnt, char *filever)
{
    osfildef *fp;
    
    /* open the file */
    if (!(fp = osfoprwtb(fname, OSFTGAME)))
        errsig(vctx->voccxerr, ERR_OPWGAM);
    
    ERRBEGIN(vctx->voccxerr)
    
    /* write the file */
    fiowrt1(mctx, vctx, tokctx, tab, fmts, fmtl, fp, flags, preinit,
            extc, prpcnt, filever);
    os_settype(fname, OSFTGAME);
   
    ERRCLEAN(vctx->voccxerr)
        /* clean up by closing the file */
        osfcls(fp);
    ERRENDCLN(vctx->voccxerr)
}